

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

void __thiscall
Scene::render(Scene *this,Shadow shadow,bool light_projection,int display_w,int display_h,
             ResourcePack *resource_pack,Camera *camera)

{
  GLenum err;
  ostream *poVar1;
  char *pcVar2;
  
  if (shadow != NoShadow) {
    render_pass(this,GenerateDepthMap,shadow,light_projection,display_w,display_h,resource_pack,
                camera);
  }
  render_pass(this,Display,shadow,light_projection,display_w,display_h,resource_pack,camera);
  while( true ) {
    err = glGetError();
    if (err == 0) break;
    poVar1 = std::operator<<((ostream *)&std::cout,"GL Error: ");
    pcVar2 = get_gl_err_str(err);
    poVar1 = std::operator<<(poVar1,pcVar2);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return;
}

Assistant:

void Scene::render(Shadow shadow, bool light_projection, int display_w, int display_h, ResourcePack& resource_pack, Camera& camera) {
    if (shadow != Shadow::NoShadow) {
        // Generate depth map
        render_pass(RenderPass::GenerateDepthMap, shadow, light_projection, display_w, display_h, resource_pack, camera);
    }

    // Render objects
    render_pass(RenderPass::Display, shadow, light_projection, display_w, display_h, resource_pack, camera);

    // Debug OpenGl errors
    GLenum err;
    while((err = glGetError()) != GL_NO_ERROR) {
        std::cout << "GL Error: " << get_gl_err_str(err) << std::endl;
    }
}